

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptorProto::MergeFrom
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *from)

{
  byte bVar1;
  int32 iVar2;
  uint uVar3;
  LogMessage *other;
  EnumValueOptions *this_00;
  EnumValueOptions *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xe03);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar3 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      set_name(this,from->name_);
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 2) != 0) {
      iVar2 = from->number_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->number_ = iVar2;
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 4) != 0) {
      this_00 = mutable_options(this);
      from_00 = from->options_;
      if (from_00 == (EnumValueOptions *)0x0) {
        from_00 = *(EnumValueOptions **)(default_instance_ + 0x18);
      }
      EnumValueOptions::MergeFrom(this_00,from_00);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void EnumValueDescriptorProto::MergeFrom(const EnumValueDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_number()) {
      set_number(from.number());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::EnumValueOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}